

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_regtest.c
# Opt level: O1

int main(int argc,char **argv)

{
  ErrorNumber EVar1;
  char *pcVar2;
  time_t tVar3;
  
  insufficientClockPrecision = 0;
  timeInProfiledCall = 0.0;
  worstProfiledCall = 0.0;
  nbProfiledCall = 0;
  doExtensiveProfiling = 0;
  putchar(10);
  pcVar2 = TA_GetVersionString();
  printf("ta_regtest V%s - Regression Tests of TA-Lib code\n",pcVar2);
  putchar(10);
  if (argc == 2) {
    pcVar2 = argv[1];
    if (((*pcVar2 != '-') || (pcVar2[1] != 'p')) || (pcVar2[2] != '\0')) goto LAB_001133ba;
    doExtensiveProfiling = 1;
  }
  if (argc < 3) {
    tVar3 = time((time_t *)0x0);
    srand((uint)tVar3);
    EVar1 = test_internals();
    if (EVar1 == TA_TEST_PASS) {
      EVar1 = test_abstract();
      if (EVar1 == TA_TEST_PASS) {
        if (doExtensiveProfiling != 0) {
          return 0;
        }
        EVar1 = test_with_simulator();
        if (EVar1 != TA_TEST_PASS) {
          return EVar1;
        }
        if (insufficientClockPrecision == 0) {
          if (0 < nbProfiledCall) {
            printf("\nNumber profiled function call       = %d function calls");
            printf("\nTotal execution time                = %g milliseconds",
                   (timeInProfiledCall / 1000000.0) / 1000.0);
            printf("\nWorst single function call          = %g milliseconds",
                   (worstProfiledCall / 1000000.0) / 1000.0);
            printf("\nAverage execution time per function = %g microseconds\n",
                   ((timeInProfiledCall / 1000000.0) / 1000000.0) / (double)nbProfiledCall);
          }
        }
        else {
          puts("\nWarning: Code profiling not supported for this platform.");
        }
        puts("\n* All tests succeeded. Enjoy the library. *");
        return 0;
      }
      pcVar2 = "Failed: Abstract interface Tests (error number = %d)\n";
    }
    else {
      pcVar2 = "\nFailed an internal test with code=%d\n";
    }
    printf(pcVar2,(ulong)EVar1);
    return EVar1;
  }
LAB_001133ba:
  printUsage();
  return 1;
}

Assistant:

int main( int argc, char **argv )
{
#ifdef WIN32
	LARGE_INTEGER QPFrequency;
#endif
   double freq;

   ErrorNumber retValue;

   (void)argv;

   insufficientClockPrecision = 0;
   timeInProfiledCall = 0.0;
   worstProfiledCall = 0.0;
   nbProfiledCall = 0;
   doExtensiveProfiling = 0;

   printf( "\n" );
   printf( "ta_regtest V%s - Regression Tests of TA-Lib code\n", TA_GetVersionString() );
   printf( "\n" );

   if( argc == 2 )
   {
	   /* Detect option to perform extended profiling. */
	   if( (argv[1][0] == '-') && (argv[1][1] == 'p') && (argv[1][2] == '\0'))
	   {
		   doExtensiveProfiling = 1;
	   }
	   else
	   {
		   printUsage();
		   return TA_REGTEST_BAD_USER_PARAM;
	   }
   }

   if( argc > 2 )
   {
      printUsage();
      return TA_REGTEST_BAD_USER_PARAM;
   }

   /* Some tests are using randomness. */
   srand( (unsigned)time( NULL ) );

   /* Test utility like List/Stack/Dictionary/Memory Allocation etc... */
   retValue = test_internals();
   if( retValue != TA_TEST_PASS )
   {
      printf( "\nFailed an internal test with code=%d\n", retValue );
      return retValue;
   }

   /* Test abstract interface. */
   retValue = test_abstract();
   if( retValue != TA_TEST_PASS )
   {
      printf( "Failed: Abstract interface Tests (error number = %d)\n", retValue );
      return retValue;
   }

   /* Perform all regresstions tests (except when ta_regtest is executed for profiling only). */
   if( !doExtensiveProfiling )
   {
      retValue = test_with_simulator();
      if( retValue != TA_TEST_PASS )
         return retValue;

      if( insufficientClockPrecision != 0 )
      {
   	   printf( "\nWarning: Code profiling not supported for this platform.\n" );
      }
      else if( nbProfiledCall > 0 )
      {
         printf( "\nNumber profiled function call       = %d function calls", nbProfiledCall );

#ifdef WIN32
         QueryPerformanceFrequency(&QPFrequency);
         freq = (double)QPFrequency.QuadPart;
         printf( "\nTotal execution time                = %g milliseconds", (timeInProfiledCall/freq)*1000.0 );
         printf( "\nWorst single function call          = %g milliseconds", (worstProfiledCall/freq)*1000.0 );
         printf( "\nAverage execution time per function = %g microseconds\n", ((timeInProfiledCall/freq)*1000000.0)/((double)nbProfiledCall) );
#else
         freq = (double)CLOCKS_PER_SEC;
         printf( "\nTotal execution time                = %g milliseconds", timeInProfiledCall/freq/1000.0 );
         printf( "\nWorst single function call          = %g milliseconds", worstProfiledCall/freq/1000.0 );
         printf( "\nAverage execution time per function = %g microseconds\n", (timeInProfiledCall/freq/1000000.0)/((double)nbProfiledCall) );
#endif
      }
      printf( "\n* All tests succeeded. Enjoy the library. *\n" );
   }


   return TA_TEST_PASS; /* Everything succeed !!! */
}